

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

size_type __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
::erase<phmap::priv::hash_internal::EnumClass>
          (raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
           *this,key_arg<phmap::priv::hash_internal::EnumClass> *key)

{
  undefined1 auVar1 [16];
  bool bVar2;
  iterator it;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *key;
  it = find<phmap::priv::hash_internal::EnumClass>
                 (this,key,SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar1,8) +
                           SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar1,0));
  bVar2 = it.ctrl_ != this->ctrl_ + this->capacity_;
  if (bVar2) {
    _erase(this,it);
  }
  return (ulong)bVar2;
}

Assistant:

size_type erase(const key_arg<K>& key) {
        auto it = find(key);
        if (it == end()) return 0;
        _erase(it);
        return 1;
    }